

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::ChNodeFEAxyzDDD
          (ChNodeFEAxyzDDD *this,ChVector<double> *initial_pos,ChVector<double> *initial_dir_u,
          ChVector<double> *initial_dir_v,ChVector<double> *initial_dir_w)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ChVariablesGenericDiagonalMass *this_00;
  ChVector<double> local_70;
  ChVector<double> local_58;
  ChVector<double> local_40;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x1d8);
  *(undefined ***)
   &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
    field_0x18 = &PTR__ChLoadable_00b2c638;
  local_40.m_data[0] = initial_pos->m_data[0];
  local_40.m_data[1] = initial_pos->m_data[1];
  local_40.m_data[2] = initial_pos->m_data[2];
  local_58.m_data[0] = initial_dir_u->m_data[0];
  local_58.m_data[1] = initial_dir_u->m_data[1];
  local_58.m_data[2] = initial_dir_u->m_data[2];
  local_70.m_data[0] = initial_dir_v->m_data[0];
  local_70.m_data[1] = initial_dir_v->m_data[1];
  local_70.m_data[2] = initial_dir_v->m_data[2];
  ChNodeFEAxyzDD::ChNodeFEAxyzDD
            (&this->super_ChNodeFEAxyzDD,&PTR_construction_vtable_32__00b57830,&local_40,&local_58,
             &local_70);
  (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
  _vptr_ChNodeFEAbase = (_func_int **)0xb573d0;
  *(undefined8 *)&this->field_0x1d8 = 0xb57770;
  *(undefined8 *)
   &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
    field_0x18 = 0xb575d0;
  (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
  super_ChVariableTupleCarrier_1vars<3>._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x2e8);
  *(double *)&(this->super_ChNodeFEAxyzDD).field_0x190 = initial_dir_w->m_data[0];
  *(double *)&this->field_0x198 = initial_dir_w->m_data[1];
  *(double *)&this->field_0x1a0 = initial_dir_w->m_data[2];
  dVar2 = VNULL;
  (this->DDD_dt).m_data[0] = VNULL;
  dVar3 = DAT_00b90ac0;
  (this->DDD_dt).m_data[1] = DAT_00b90ac0;
  dVar4 = DAT_00b90ac8;
  (this->DDD_dt).m_data[2] = DAT_00b90ac8;
  (this->DDD_dtdt).m_data[0] = dVar2;
  (this->DDD_dtdt).m_data[1] = dVar3;
  (this->DDD_dtdt).m_data[2] = dVar4;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,3);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyzDD).field_0x188 = this_00;
  lVar1 = (this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (-1 < lVar1) {
    if (lVar1 != 0) {
      memset((this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data,0,lVar1 << 3);
    }
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

ChNodeFEAxyzDDD::ChNodeFEAxyzDDD(ChVector<> initial_pos, ChVector<> initial_dir_u, ChVector<> initial_dir_v, ChVector<> initial_dir_w)
    : ChNodeFEAxyzDD(initial_pos, initial_dir_u, initial_dir_v), DDD(initial_dir_w), DDD_dt(VNULL), DDD_dtdt(VNULL) {
    variables_DDD = new ChVariablesGenericDiagonalMass(3);
    // default: no atomic mass associated to fea node, the fea element will add mass matrix
    variables_DDD->GetMassDiagonal().setZero();
}